

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XercesGroupInfo.hpp
# Opt level: O1

void __thiscall
xercesc_4_0::XercesGroupInfo::addElement(XercesGroupInfo *this,SchemaElementDecl *elem)

{
  BaseRefVectorOf<xercesc_4_0::SchemaElementDecl> *this_00;
  ulong uVar1;
  XMLSize_t XVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  
  this_00 = &this->fElements->super_BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>;
  uVar1 = this_00->fCurCount;
  bVar5 = uVar1 != 0;
  if (bVar5) {
    if (*this_00->fElemList == elem) {
      return;
    }
    uVar3 = 1;
    do {
      uVar4 = uVar3;
      if (uVar1 == uVar4) break;
      uVar3 = uVar4 + 1;
    } while (this_00->fElemList[uVar4] != elem);
    bVar5 = uVar4 < uVar1;
  }
  if (!bVar5) {
    BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>::ensureExtraCapacity(this_00,1);
    XVar2 = this_00->fCurCount;
    this_00->fElemList[XVar2] = elem;
    this_00->fCurCount = XVar2 + 1;
  }
  return;
}

Assistant:

inline void XercesGroupInfo::addElement(SchemaElementDecl* const elem) {

    if (!fElements->containsElement(elem))
        fElements->addElement(elem);
}